

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O2

void __thiscall
kratos::Property::Property
          (Property *this,string *property_name,shared_ptr<kratos::Sequence> *sequence)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)property_name);
  (this->sequence_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->sequence_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sequence_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (sequence->super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->action_ = None;
  (this->edge_).delay = 0;
  (this->edge_).var = (Var *)0x0;
  *(undefined8 *)((long)&(this->edge_).var + 4) = 0;
  (this->edge_).edge = Posedge;
  (this->edge_).delay_side = left;
  return;
}

Assistant:

Property::Property(std::string property_name, std::shared_ptr<Sequence> sequence)
    : property_name_(std::move(property_name)), sequence_(std::move(sequence)) {}